

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eddsa_sig.c
# Opt level: O0

int ed448_digest_verify(void *vpeddsactx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  uint8_t *in_RCX;
  long in_RDX;
  uint8_t *in_RDI;
  size_t in_R8;
  ECX_KEY *edkey;
  PROV_EDDSA_CTX *peddsactx;
  uint8_t *in_stack_ffffffffffffffb8;
  uint8_t *public_key;
  uint8_t *context_len;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  public_key = *(uint8_t **)(in_RDI + 8);
  context_len = in_RDI;
  iVar1 = ossl_prov_is_running();
  if ((iVar1 == 0) || (in_RDX != 0x72)) {
    iVar1 = 0;
  }
  else {
    iVar1 = ossl_ed448_verify((OSSL_LIB_CTX *)0x72,in_RCX,in_R8,in_RDI,public_key,
                              in_stack_ffffffffffffffb8,(size_t)context_len,
                              (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
    ;
  }
  return iVar1;
}

Assistant:

int ed448_digest_verify(void *vpeddsactx, const unsigned char *sig,
                        size_t siglen, const unsigned char *tbs,
                        size_t tbslen)
{
    PROV_EDDSA_CTX *peddsactx = (PROV_EDDSA_CTX *)vpeddsactx;
    const ECX_KEY *edkey = peddsactx->key;

    if (!ossl_prov_is_running() || siglen != ED448_SIGSIZE)
        return 0;

#ifdef S390X_EC_ASM
    if (S390X_CAN_SIGN(ED448))
        return s390x_ed448_digestverify(edkey, sig, tbs, tbslen);
#endif /* S390X_EC_ASM */

    return ossl_ed448_verify(peddsactx->libctx, tbs, tbslen, sig, edkey->pubkey,
                             NULL, 0, edkey->propq);
}